

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Core.c
# Opt level: O3

Abc_Cex_t * Llb_CoreDeriveCex(Llb_Img_t *p)

{
  ulong uVar1;
  void **ppvVar2;
  void *pvVar3;
  Aig_Man_t *pAVar4;
  Vec_Ptr_t *pVVar5;
  bool bVar6;
  int iVar7;
  char *string;
  long lVar8;
  Vec_Ptr_t *pVVar9;
  Abc_Cex_t *p_00;
  DdNode *pDVar10;
  DdNode *n;
  DdNode *pDVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  Vec_Ptr_t *vQuant1;
  Vec_Ptr_t *vQuant0;
  Abc_Cex_t *local_38;
  
  iVar7 = Cudd_ReadSize(p->ddR);
  string = (char *)malloc((long)iVar7);
  if (p->vRings->nSize < 1) {
    __assert_fail("Vec_PtrSize(p->vRings) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb2Core.c"
                  ,0x6a,"Abc_Cex_t *Llb_CoreDeriveCex(Llb_Img_t *)");
  }
  p->dd->TimeStop = 0;
  p->ddR->TimeStop = 0;
  pVVar9 = p->vDdMans;
  uVar14 = pVVar9->nSize;
  lVar8 = (long)(int)uVar14;
  if (1 < lVar8) {
    uVar12 = 0;
    do {
      lVar8 = lVar8 + -1;
      ppvVar2 = pVVar9->pArray;
      pvVar3 = ppvVar2[uVar12];
      ppvVar2[uVar12] = ppvVar2[lVar8];
      pVVar9->pArray[lVar8] = pvVar3;
      uVar12 = uVar12 + 1;
    } while (uVar14 >> 1 != uVar12);
    pVVar9 = p->vDdMans;
  }
  pVVar9 = Llb_ImgSupports(p->pAig,pVVar9,p->vVarsNs,p->vVarsCs,1,0);
  Llb_ImgSchedule(pVVar9,&vQuant0,&vQuant1,0);
  iVar7 = pVVar9->nSize;
  if (0 < iVar7) {
    lVar8 = 0;
    do {
      pvVar3 = pVVar9->pArray[lVar8];
      if (pvVar3 != (void *)0x0) {
        if (*(void **)((long)pvVar3 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar3 + 8));
        }
        free(pvVar3);
        iVar7 = pVVar9->nSize;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar7);
  }
  if (pVVar9->pArray != (void **)0x0) {
    free(pVVar9->pArray);
  }
  free(pVVar9);
  Llb_ImgQuantifyReset(p->vDdMans);
  p_00 = Abc_CexAlloc(p->pAig->nRegs,p->pAig->nTruePis,p->vRings->nSize);
  pVVar9 = p->vRings;
  iVar7 = pVVar9->nSize;
  p_00->iFrame = iVar7 + -1;
  p_00->iPo = -1;
  if ((long)iVar7 < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                  ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
  }
  pDVar10 = Cudd_bddIntersect(p->ddR,(DdNode *)pVVar9->pArray[(long)iVar7 + -1],p->ddR->bFunc);
  Cudd_Ref(pDVar10);
  iVar7 = Cudd_bddPickOneCube(p->ddR,pDVar10,string);
  Cudd_RecursiveDeref(p->ddR,pDVar10);
  if (iVar7 == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb2Core.c"
                  ,0x80,"Abc_Cex_t *Llb_CoreDeriveCex(Llb_Img_t *)");
  }
  pAVar4 = p->pAig;
  pVVar9 = p->vRings;
  iVar7 = pAVar4->nTruePis;
  uVar14 = pVVar9->nSize;
  iVar13 = (uVar14 - 1) * iVar7 + pAVar4->nRegs;
  if (0 < iVar7) {
    pVVar5 = pAVar4->vCis;
    lVar8 = 0;
    do {
      if (pVVar5->nSize <= (int)lVar8) goto LAB_0083ac7e;
      if (string[lVar8 + pAVar4->nRegs] == '\x01') {
        iVar7 = iVar13 + (int)lVar8;
        (&p_00[1].iPo)[iVar7 >> 5] = (&p_00[1].iPo)[iVar7 >> 5] | 1 << ((byte)iVar7 & 0x1f);
        iVar7 = pAVar4->nTruePis;
      }
      lVar8 = lVar8 + 1;
    } while ((int)lVar8 < iVar7);
    uVar14 = pVVar9->nSize;
  }
  if ((int)uVar14 < 2) {
    pDVar10 = (DdNode *)0x0;
  }
  else {
    pDVar10 = Llb_CoreComputeCube(p->dd,p->vVarsNs,1,string);
    Cudd_Ref(pDVar10);
    uVar14 = p->vRings->nSize;
  }
  if (0 < (int)uVar14) {
    uVar12 = (ulong)uVar14;
    local_38 = p_00;
    do {
      uVar14 = p->vRings->nSize;
      if ((long)(int)uVar14 < (long)uVar12) goto LAB_0083ac7e;
      uVar1 = uVar12 - 1;
      if (uVar12 != uVar14) {
        pDVar11 = (DdNode *)p->vRings->pArray[uVar1];
        n = Llb_ImgComputeImage(p->pAig,p->vDdMans,p->dd,pDVar10,vQuant0,vQuant1,p->vDriRefs,
                                p->pPars->TimeTarget,1,0,0);
        if (n == (DdNode *)0x0) {
          __assert_fail("bImage != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb2Core.c"
                        ,0x95,"Abc_Cex_t *Llb_CoreDeriveCex(Llb_Img_t *)");
        }
        Cudd_Ref(n);
        Cudd_RecursiveDeref(p->dd,pDVar10);
        pDVar10 = Extra_TransferPermute(p->dd,p->ddR,n,p->vCs2Glo->pArray);
        Cudd_Ref(pDVar10);
        Cudd_RecursiveDeref(p->dd,n);
        pDVar11 = Cudd_bddIntersect(p->ddR,pDVar10,pDVar11);
        Cudd_Ref(pDVar11);
        Cudd_RecursiveDeref(p->ddR,pDVar10);
        iVar7 = Cudd_bddPickOneCube(p->ddR,pDVar11,string);
        Cudd_RecursiveDeref(p->ddR,pDVar11);
        p_00 = local_38;
        if (iVar7 == 0) {
          __assert_fail("RetValue",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb2Core.c"
                        ,0xa5,"Abc_Cex_t *Llb_CoreDeriveCex(Llb_Img_t *)");
        }
        pAVar4 = p->pAig;
        iVar7 = pAVar4->nTruePis;
        iVar13 = iVar13 - iVar7;
        if (0 < iVar7) {
          pVVar9 = pAVar4->vCis;
          lVar8 = 0;
          do {
            if (pVVar9->nSize <= (int)lVar8) goto LAB_0083ac7e;
            if (string[lVar8 + pAVar4->nRegs] == '\x01') {
              iVar7 = iVar13 + (int)lVar8;
              (&local_38[1].iPo)[iVar7 >> 5] =
                   (&local_38[1].iPo)[iVar7 >> 5] | 1 << ((byte)iVar7 & 0x1f);
              iVar7 = pAVar4->nTruePis;
            }
            lVar8 = lVar8 + 1;
          } while ((int)lVar8 < iVar7);
        }
        if (uVar1 == 0) {
          if (0 < (long)pAVar4->nRegs) {
            lVar8 = 0;
            goto LAB_0083ab56;
          }
          break;
        }
        pDVar10 = Llb_CoreComputeCube(p->dd,p->vVarsNs,1,string);
        Cudd_Ref(pDVar10);
      }
      bVar6 = 1 < (long)uVar12;
      uVar12 = uVar1;
    } while (bVar6);
  }
LAB_0083ab83:
  if (iVar13 != p->pAig->nRegs) {
    __assert_fail("nPiOffset == Saig_ManRegNum(p->pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb2Core.c"
                  ,0xb8,"Abc_Cex_t *Llb_CoreDeriveCex(Llb_Img_t *)");
  }
  iVar7 = Saig_ManFindFailedPoCex(p->pInit,p_00);
  if ((-1 < iVar7) && (iVar7 < p->pInit->nTruePos)) {
    p_00->iPo = iVar7;
    if (string != (char *)0x0) {
      free(string);
    }
    iVar7 = vQuant0->nSize;
    if (0 < iVar7) {
      lVar8 = 0;
      do {
        pvVar3 = vQuant0->pArray[lVar8];
        if (pvVar3 != (void *)0x0) {
          if (*(void **)((long)pvVar3 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar3 + 8));
          }
          free(pvVar3);
          iVar7 = vQuant0->nSize;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < iVar7);
    }
    if (vQuant0->pArray != (void **)0x0) {
      free(vQuant0->pArray);
    }
    free(vQuant0);
    iVar7 = vQuant1->nSize;
    if (0 < iVar7) {
      lVar8 = 0;
      do {
        pvVar3 = vQuant1->pArray[lVar8];
        if (pvVar3 != (void *)0x0) {
          if (*(void **)((long)pvVar3 + 8) != (void *)0x0) {
            free(*(void **)((long)pvVar3 + 8));
          }
          free(pvVar3);
          iVar7 = vQuant1->nSize;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < iVar7);
    }
    if (vQuant1->pArray != (void **)0x0) {
      free(vQuant1->pArray);
    }
    free(vQuant1);
    return p_00;
  }
  __assert_fail("RetValue >= 0 && RetValue < Saig_ManPoNum(p->pInit)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb2Core.c"
                ,0xbb,"Abc_Cex_t *Llb_CoreDeriveCex(Llb_Img_t *)");
  while( true ) {
    if (string[lVar8] != '\0') {
      __assert_fail("pValues[i] == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb2Core.c"
                    ,0xb1,"Abc_Cex_t *Llb_CoreDeriveCex(Llb_Img_t *)");
    }
    lVar8 = lVar8 + 1;
    if (pAVar4->nRegs == lVar8) break;
LAB_0083ab56:
    if ((iVar7 < 0) || (pAVar4->vCis->nSize <= iVar7 + (int)lVar8)) {
LAB_0083ac7e:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
  }
  goto LAB_0083ab83;
}

Assistant:

Abc_Cex_t * Llb_CoreDeriveCex( Llb_Img_t * p )
{
    Abc_Cex_t * pCex;
    Aig_Obj_t * pObj;
    Vec_Ptr_t * vSupps, * vQuant0, * vQuant1;
    DdNode * bState = NULL, * bImage, * bOneCube, * bTemp, * bRing;
    int i, v, RetValue, nPiOffset;
    char * pValues = ABC_ALLOC( char, Cudd_ReadSize(p->ddR) );
    assert( Vec_PtrSize(p->vRings) > 0 );

    p->dd->TimeStop  = 0;
    p->ddR->TimeStop = 0;

    // get supports and quantified variables
    Vec_PtrReverseOrder( p->vDdMans );
    vSupps = Llb_ImgSupports( p->pAig, p->vDdMans, p->vVarsNs, p->vVarsCs, 1, 0 );
    Llb_ImgSchedule( vSupps, &vQuant0, &vQuant1, 0 );
    Vec_VecFree( (Vec_Vec_t *)vSupps );
    Llb_ImgQuantifyReset( p->vDdMans );
//    Llb_ImgQuantifyFirst( p->pAig, p->vDdMans, vQuant0 );

    // allocate room for the counter-example
    pCex = Abc_CexAlloc( Saig_ManRegNum(p->pAig), Saig_ManPiNum(p->pAig), Vec_PtrSize(p->vRings) );
    pCex->iFrame = Vec_PtrSize(p->vRings) - 1;
    pCex->iPo = -1;

    // get the last cube
    bOneCube = Cudd_bddIntersect( p->ddR, (DdNode *)Vec_PtrEntryLast(p->vRings), p->ddR->bFunc );  Cudd_Ref( bOneCube );
    RetValue = Cudd_bddPickOneCube( p->ddR, bOneCube, pValues );
    Cudd_RecursiveDeref( p->ddR, bOneCube );
    assert( RetValue );

    // write PIs of counter-example
    nPiOffset = Saig_ManRegNum(p->pAig) + Saig_ManPiNum(p->pAig) * (Vec_PtrSize(p->vRings) - 1);
    Saig_ManForEachPi( p->pAig, pObj, i )
        if ( pValues[Saig_ManRegNum(p->pAig)+i] == 1 )
            Abc_InfoSetBit( pCex->pData, nPiOffset + i );

    // write state in terms of NS variables
    if ( Vec_PtrSize(p->vRings) > 1 )
    {
        bState = Llb_CoreComputeCube( p->dd, p->vVarsNs, 1, pValues );   Cudd_Ref( bState );
    }
    // perform backward analysis
    Vec_PtrForEachEntryReverse( DdNode *, p->vRings, bRing, v )
    { 
        if ( v == Vec_PtrSize(p->vRings) - 1 )
            continue;
        // compute the next states
        bImage = Llb_ImgComputeImage( p->pAig, p->vDdMans, p->dd, bState, 
            vQuant0, vQuant1, p->vDriRefs, p->pPars->TimeTarget, 1, 0, 0 );
        assert( bImage != NULL );
        Cudd_Ref( bImage );
        Cudd_RecursiveDeref( p->dd, bState );
//Extra_bddPrintSupport( p->dd, bImage ); printf( "\n" );

        // move reached states into ring manager
        bImage = Extra_TransferPermute( p->dd, p->ddR, bTemp = bImage, Vec_IntArray(p->vCs2Glo) );    Cudd_Ref( bImage );
        Cudd_RecursiveDeref( p->dd, bTemp );

        // intersect with the previous set
        bOneCube = Cudd_bddIntersect( p->ddR, bImage, bRing );                Cudd_Ref( bOneCube );
        Cudd_RecursiveDeref( p->ddR, bImage );

        // find any assignment of the BDD
        RetValue = Cudd_bddPickOneCube( p->ddR, bOneCube, pValues );
        Cudd_RecursiveDeref( p->ddR, bOneCube );
        assert( RetValue );

        // write PIs of counter-example
        nPiOffset -= Saig_ManPiNum(p->pAig);
        Saig_ManForEachPi( p->pAig, pObj, i )
            if ( pValues[Saig_ManRegNum(p->pAig)+i] == 1 )
                Abc_InfoSetBit( pCex->pData, nPiOffset + i );

        // check that we get the init state
        if ( v == 0 )
        {
            Saig_ManForEachLo( p->pAig, pObj, i )
                assert( pValues[i] == 0 );
            break;
        }

        // write state in terms of NS variables
        bState = Llb_CoreComputeCube( p->dd, p->vVarsNs, 1, pValues );   Cudd_Ref( bState );
    }
    assert( nPiOffset == Saig_ManRegNum(p->pAig) );
    // update the output number
    RetValue = Saig_ManFindFailedPoCex( p->pInit, pCex );
    assert( RetValue >= 0 && RetValue < Saig_ManPoNum(p->pInit) ); // invalid CEX!!!
    pCex->iPo = RetValue;
    // cleanup
    ABC_FREE( pValues );
    Vec_VecFree( (Vec_Vec_t *)vQuant0 );
    Vec_VecFree( (Vec_Vec_t *)vQuant1 );
    return pCex;
}